

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

bool Js::JavascriptOperators::IsConstructor(JavascriptProxy *instance)

{
  bool bVar1;
  int iVar2;
  RecyclableObject *obj;
  bool local_49;
  JavascriptFunction *local_48;
  JavascriptProxy *local_40;
  JavascriptFunction *function;
  RecyclableObject *targetInstance;
  JavascriptProxy *proxy;
  JavascriptProxy *instance_local;
  
  targetInstance = (RecyclableObject *)instance;
  do {
    obj = Js::JavascriptProxy::GetTarget((JavascriptProxy *)targetInstance);
    bVar1 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(obj);
    if (bVar1) {
      local_40 = UnsafeVarTo<Js::JavascriptProxy,Js::RecyclableObject>(obj);
    }
    else {
      local_40 = (JavascriptProxy *)0x0;
    }
    targetInstance = (RecyclableObject *)local_40;
  } while (local_40 != (JavascriptProxy *)0x0);
  bVar1 = VarIs<Js::JavascriptFunction,Js::RecyclableObject>(obj);
  if (bVar1) {
    local_48 = UnsafeVarTo<Js::JavascriptFunction,Js::RecyclableObject>(obj);
  }
  else {
    local_48 = (JavascriptFunction *)0x0;
  }
  local_49 = false;
  if (local_48 != (JavascriptFunction *)0x0) {
    iVar2 = (*(local_48->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x70])();
    local_49 = iVar2 != 0;
  }
  return local_49;
}

Assistant:

bool JavascriptOperators::IsConstructor(_In_ JavascriptProxy * instance)
    {
        // If it is a proxy, follow to the end of the proxy chain before checking if it is a constructor again.
        JavascriptProxy * proxy = instance;
        while (true)
        {
            RecyclableObject* targetInstance = proxy->GetTarget();
            proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(targetInstance);
            if (proxy == nullptr)
            {
                JavascriptFunction* function = JavascriptOperators::TryFromVar<JavascriptFunction>(targetInstance);
                return function && function->IsConstructor();
            }
        }
    }